

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O3

void __thiscall cubeb_init_destroy_context_Test::TestBody(cubeb_init_destroy_context_Test *this)

{
  AssertHelper AVar1;
  bool bVar2;
  char *pcVar3;
  AssertHelperData *this_00;
  stringstream *psVar4;
  int line;
  anon_enum_32 *in_RCX;
  AssertionResult gtest_ar;
  cubeb *ctx;
  int r;
  AssertHelper local_60;
  AssertionResult local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [2];
  cubeb *local_38;
  int local_2c;
  AssertHelper local_28;
  
  local_2c = common_init(&local_38,"test_sanity");
  local_48[0].ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_48[0].ptr_._4_4_ << 0x20);
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&local_58.success_,(char *)&local_2c,(int *)local_48,in_RCX);
  if (local_58.success_ == false) {
    psVar4 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar4);
    *(undefined8 *)(psVar4 + *(long *)(*(long *)(psVar4 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_58.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_58.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x54;
    local_48[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4;
LAB_00107925:
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,line,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48[0].ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00107966;
    bVar2 = testing::internal::IsTrue(true);
    AVar1.data_ = (AssertHelperData *)local_48[0].ptr_;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_48[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)&local_58,"ctx","nullptr",&local_38,&local_48[0].ptr_);
    if (local_58.success_ == false) {
      psVar4 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar4);
      *(undefined8 *)(psVar4 + *(long *)(*(long *)(psVar4 + 0x10) + -0x18) + 0x18) = 0x11;
      if (local_58.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_58.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x55;
      local_48[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4;
      goto LAB_00107925;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar3 = cubeb_get_backend_id(local_38);
    local_58.success_ = pcVar3 != (char *)0x0;
    local_58.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_58.success_) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      fprintf(_stderr,"Backend: %s\n",pcVar3);
      cubeb_destroy(local_38);
      return;
    }
    this_00 = (AssertHelperData *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)this_00);
    *(undefined8 *)((long)&(this_00->message).c_str_ + *(long *)(*(long *)&this_00->line + -0x18)) =
         0x11;
    local_60.data_ = this_00;
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)local_48,&local_58,"backend_id","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,0x58,(char *)local_48[0].ptr_);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(local_48[0].ptr_);
    }
    if (local_60.data_ == (AssertHelperData *)0x0) goto LAB_00107966;
    bVar2 = testing::internal::IsTrue(true);
    AVar1.data_ = local_60.data_;
  }
  if ((bVar2) && (AVar1.data_ != (AssertHelperData *)0x0)) {
    (**(code **)(*(long *)AVar1.data_ + 8))();
  }
LAB_00107966:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cubeb, init_destroy_context)
{
  int r;
  cubeb * ctx;
  char const* backend_id;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  backend_id = cubeb_get_backend_id(ctx);
  ASSERT_TRUE(backend_id);

  fprintf(stderr, "Backend: %s\n", backend_id);

  cubeb_destroy(ctx);
}